

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int add_f5_gquad(vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int local_68;
  int local_64;
  int *ggg;
  int *f5;
  int turn;
  int *indx;
  int local_38;
  int ij;
  int i;
  int e;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar1 = (fc->matrices->field_2).field_0.f5;
  piVar2 = (fc->matrices->field_2).field_0.ggg;
  iVar3 = (fc->params->model_details).min_loop_size;
  indx._4_4_ = (fc->jindx[j] + j) - iVar3;
  ij = 10000000;
  local_38 = j - iVar3;
  while( true ) {
    iVar3 = local_38;
    local_38 = iVar3 + -1;
    indx._4_4_ = indx._4_4_ + -1;
    if (local_38 < 2) break;
    if ((piVar1[iVar3 + -2] != 10000000) && (piVar2[indx._4_4_] != 10000000)) {
      if (ij < piVar1[iVar3 + -2] + piVar2[indx._4_4_]) {
        local_64 = ij;
      }
      else {
        local_64 = piVar1[iVar3 + -2] + piVar2[indx._4_4_];
      }
      ij = local_64;
    }
  }
  iVar3 = fc->jindx[j] + 1;
  if (ij < piVar2[iVar3]) {
    local_68 = ij;
  }
  else {
    local_68 = piVar2[iVar3];
  }
  return local_68;
}

Assistant:

int
add_f5_gquad(vrna_fold_compound_t       *fc,
             int                        j,
             vrna_callback_hc_evaluate  *evaluate,
             struct default_data        *hc_dat_local,
             struct sc_wrapper_f5       *sc_wrapper)
{
  int e, i, ij, *indx, turn, *f5, *ggg;

  indx  = fc->jindx;
  f5    = fc->matrices->f5;
  ggg   = fc->matrices->ggg;
  turn  = fc->params->model_details.min_loop_size;
  ij    = indx[j] + j - turn - 1;
  e     = INF;

  for (i = j - turn - 1; i > 1; i--, ij--)
    if ((f5[i - 1] != INF) && (ggg[ij] != INF))
      e = MIN2(e, f5[i - 1] + ggg[ij]);

  ij  = indx[j] + 1;
  e   = MIN2(e, ggg[ij]);

  return e;
}